

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

_Bool borg_twitchy(void)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  borg_grid *pbVar5;
  loc l;
  borg_grid *grid;
  uint32_t uStack_10;
  _Bool all_walls;
  wchar_t count;
  wchar_t dir;
  
  bVar1 = true;
  borg_note("# Twitchy!");
  _Var2 = borg_allow_teleport();
  if (((!_Var2) || (_Var2 = borg_caution_phase(L'\x0f',L'\x02'), !_Var2)) ||
     ((_Var2 = borg_spell_fail(PHASE_DOOR,0x28), !_Var2 &&
      ((((_Var2 = borg_spell_fail(PORTAL,0x28), !_Var2 && (_Var2 = borg_shadow_shift(L'('), !_Var2))
        && (_Var2 = borg_activate_item(act_tele_phase), !_Var2)) &&
       ((_Var2 = borg_activate_item(act_tele_long), !_Var2 &&
        (_Var2 = borg_read_scroll(sv_scroll_phase_door), !_Var2)))))))) {
    grid._4_4_ = 0x14;
    do {
      do {
        do {
          uStack_10 = Rand_div(10);
        } while (uStack_10 == 5);
      } while (uStack_10 == 0);
      if (grid._4_4_ == 0) break;
      grid._4_4_ = grid._4_4_ + -1;
      borg.goal.g.x = borg.c.x + ddx[(int)uStack_10];
      borg.goal.g.y = borg.c.y + ddy[(int)uStack_10];
      grid_00.y = borg.goal.g.y;
      grid_00.x = borg.goal.g.x;
      _Var2 = square_in_bounds_fully((chunk *)cave,grid_00);
    } while (((!_Var2) ||
             ((pbVar5 = borg_grids[borg.goal.g.y] + borg.goal.g.x, 0xe < pbVar5->feat &&
              (pbVar5->feat < 0x17)))) || ((pbVar5->kill != '\0' && (borg.trait[0x71] != 0))));
    if (grid._4_4_ == 0) {
      for (uStack_10 = 1; (int)uStack_10 < 10; uStack_10 = uStack_10 + 1) {
        if (uStack_10 != 5) {
          wVar3 = borg.c.x + ddx[(int)uStack_10];
          wVar4 = borg.c.y + ddy[(int)uStack_10];
          grid_01.y = wVar4;
          grid_01.x = wVar3;
          _Var2 = square_in_bounds_fully((chunk *)cave,grid_01);
          if ((_Var2) &&
             ((((pbVar5 = borg_grids[wVar4] + wVar3, pbVar5->feat < 0xf || (0x16 < pbVar5->feat)) ||
               ((borg.trait[0x71] != 0 && (pbVar5->feat != '\x16')))) &&
              ((pbVar5->kill == '\0' || (borg.trait[0x71] == 0)))))) {
            bVar1 = false;
            break;
          }
        }
      }
      if (bVar1) {
        borg_keypress(0x52);
        borg_keypress(0x31);
        borg_keypress(0x30);
        borg_keypress(0x30);
        borg_keypress(0x9c);
        return true;
      }
    }
    if (borg.trait[0x71] != 0) {
      borg_keypress(0x2b);
    }
    borg_keypress(uStack_10 + 0x30);
  }
  return true;
}

Assistant:

bool borg_twitchy(void)
{
    int dir = 5;
    int count;
    bool all_walls = true;
    borg_grid * grid = NULL;
    struct loc l;

    /* This is a bad thing */
    borg_note("# Twitchy!");

    /* try to phase out of it */
    if (borg_allow_teleport()) {
        if (borg_caution_phase(15, 2)
            && (borg_spell_fail(PHASE_DOOR, 40) || borg_spell_fail(PORTAL, 40)
                || borg_shadow_shift(40) || borg_activate_item(act_tele_phase)
                || borg_activate_item(act_tele_long)
                || borg_read_scroll(sv_scroll_phase_door))) {
            /* We did something */
            return true;
        }
    }

    /* Pick a random direction */
    count = 20;
    while (true) {
        dir = randint0(10);
        if (dir == 5 || dir == 0)
            continue;

        if (!count)
            break;

        count--;

        /* Hack -- set goal */
        borg.goal.g.x = borg.c.x + ddx[dir];
        borg.goal.g.y = borg.c.y + ddy[dir];

        if (!square_in_bounds_fully(cave, borg.goal.g))
            continue;

        grid = &borg_grids[borg.goal.g.y][borg.goal.g.x];

        /* don't twitch into walls */
        if (grid->feat >= FEAT_SECRET && grid->feat <= FEAT_PERM)
            continue;

        /* monsters count as walls if afraid */
        if (grid->kill && borg.trait[BI_ISAFRAID])
            continue;

        break;
    }

    /* if we can't find a direction, maybe we are surrounded by walls */
    if (!count) {
        for (dir = 1; dir < 10; dir++) {
            if (dir == 5)
                continue;

            /* get the location of postion + direction */
            l.x = borg.c.x + ddx[dir];
            l.y = borg.c.y + ddy[dir];

            if (!square_in_bounds_fully(cave, l))
                continue;

            grid = &borg_grids[l.y][l.x];

            /* don't twitch into walls */
            if (grid->feat >= FEAT_SECRET && grid->feat <= FEAT_PERM) {
                /* unless afraid (and even then, not perm walls) */
                if (!borg.trait[BI_ISAFRAID] || grid->feat == FEAT_PERM)
                    continue;
            }

            /* monsters count as walls if afraid */
            if (grid->kill && borg.trait[BI_ISAFRAID])
                continue;

            all_walls = false;
            break;
        }
        if (all_walls) {
            /* Rest until done */
            borg_keypress('R');
            borg_keypress('1');
            borg_keypress('0');
            borg_keypress('0');
            borg_keypress(KC_ENTER);
            /* We did something */
            return true;
        }
    }

    /* Normally move */

    /* if afraid, we need to try to dig. We have tried everything else */
    /* digging will at least take an action so maybe give time to not be */
    /* afraid */
    if (borg.trait[BI_ISAFRAID])
        borg_keypress('+');

    /* Send direction */
    borg_keypress(I2D(dir));

    /* We did something */
    return true;
}